

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V5_annotation.cpp
# Opt level: O1

bool __thiscall
ON_OBSOLETE_V2_DimAngular::Write(ON_OBSOLETE_V2_DimAngular *this,ON_BinaryArchive *file)

{
  bool bVar1;
  
  bVar1 = ON_OBSOLETE_V2_Annotation::Write(&this->super_ON_OBSOLETE_V2_Annotation,file);
  if (bVar1) {
    bVar1 = ON_BinaryArchive::WriteDouble(file,this->m_angle);
  }
  if (bVar1 != false) {
    bVar1 = ON_BinaryArchive::WriteDouble(file,this->m_radius);
    return bVar1;
  }
  return false;
}

Assistant:

bool ON_OBSOLETE_V2_DimAngular::Write( ON_BinaryArchive& file ) const
{
  bool rc = ON_OBSOLETE_V2_Annotation::Write( file );
  if( rc )
    rc = file.WriteDouble( m_angle );
  if( rc )
    rc = file.WriteDouble( m_radius );
  return rc;
}